

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O3

string_t __thiscall
duckdb::TrimOperator<false,true>::Operation<duckdb::string_t,duckdb::string_t>
          (TrimOperator<false,true> *this,string_t input,Vector *result)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  void *__src;
  ulong uVar5;
  char *__dest;
  utf8proc_int32_t codepoint;
  string_t target;
  int local_54;
  undefined1 local_50 [16];
  undefined8 local_40;
  void *local_38;
  
  local_38 = input.value._0_8_;
  __src = local_38;
  if ((uint)this < 0xd) {
    __src = (void *)((long)&local_40 + 4);
  }
  local_40 = this;
  if ((uint)this == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    uVar5 = 0;
    do {
      lVar3 = duckdb::utf8proc_iterate
                        ((uchar *)((long)__src + uVar5),((ulong)this & 0xffffffff) - uVar5,&local_54
                        );
      uVar5 = uVar5 + lVar3;
      iVar2 = duckdb::utf8proc_category(local_54);
      if (iVar2 != 0x17) {
        uVar4 = uVar5;
      }
    } while (uVar5 < ((ulong)this & 0xffffffff));
  }
  local_50 = duckdb::StringVector::EmptyString(input.value._8_8_,uVar4);
  __dest = local_50._8_8_;
  if (local_50._0_4_ < 0xd) {
    __dest = local_50 + 4;
  }
  memcpy(__dest,__src,uVar4);
  uVar1 = local_50._0_8_;
  uVar4 = uVar1 & 0xffffffff;
  if (uVar4 < 0xd) {
    memset(local_50 + 4 + uVar4,0,0xc - uVar4);
  }
  else {
    local_50._4_4_ = *(undefined4 *)local_50._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_50;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		utf8proc_int32_t codepoint;
		auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		// Find the first character that is not left trimmed
		idx_t begin = 0;
		if (LTRIM) {
			while (begin < size) {
				auto bytes =
				    utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				D_ASSERT(bytes > 0);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					break;
				}
				begin += UnsafeNumericCast<idx_t>(bytes);
			}
		}

		// Find the last character that is not right trimmed
		idx_t end;
		if (RTRIM) {
			end = begin;
			for (auto next = begin; next < size;) {
				auto bytes = utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				D_ASSERT(bytes > 0);
				next += UnsafeNumericCast<idx_t>(bytes);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					end = next;
				}
			}
		} else {
			end = size;
		}

		// Copy the trimmed string
		auto target = StringVector::EmptyString(result, end - begin);
		auto output = target.GetDataWriteable();
		memcpy(output, data + begin, end - begin);

		target.Finalize();
		return target;
	}